

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusVtxAttrShort::emulate_mthd(MthdCelsiusVtxAttrShort *this)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    iVar2 = 0;
    for (lVar3 = 0x30; lVar3 != 0x10; lVar3 = lVar3 + -0x10) {
      uVar1 = pgraph_idx_short_to_float
                        (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                         (int16_t)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                                   ((byte)lVar3 & 0x3f)) >> 0x30));
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2 + this->which * 4 +
       iVar2] = uVar1;
      iVar2 = iVar2 + 1;
    }
    if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
      iVar2 = this->which;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_xfrm
      [(long)iVar2 + -7][2] = 0;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [iVar2 * 4 + 3] = 0x3f800000;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				int16_t v = extrs(val, i * 16, 16);
				exp.celsius_pipe_vtx[which * 4 + idx * 2 + i] = pgraph_idx_short_to_float(&exp, v);
			}
			if (idx == 0) {
				exp.celsius_pipe_vtx[which * 4 + 2] = 0;
				exp.celsius_pipe_vtx[which * 4 + 3] = 0x3f800000;
			}
		}
	}